

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

void __thiscall LiteScript::State::AddInstruction(State *this,Instruction *in)

{
  pointer pvVar1;
  uint uVar2;
  ulong uVar3;
  pointer pvVar5;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> local_28;
  ulong uVar4;
  
  pvVar1 = (this->instr).
           super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->instr).
           super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 == pvVar1) {
    local_28.super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<LiteScript::Instruction,std::allocator<LiteScript::Instruction>>,std::allocator<std::vector<LiteScript::Instruction,std::allocator<LiteScript::Instruction>>>>
    ::emplace_back<std::vector<LiteScript::Instruction,std::allocator<LiteScript::Instruction>>>
              ((vector<std::vector<LiteScript::Instruction,std::allocator<LiteScript::Instruction>>,std::allocator<std::vector<LiteScript::Instruction,std::allocator<LiteScript::Instruction>>>>
                *)this,&local_28);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::~vector
              (&local_28);
    pvVar1 = (this->instr).
             super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (this->instr).
             super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar4 = (ulong)this->instr_index;
  uVar3 = ((long)pvVar5 - (long)pvVar1 >> 3) * -0x5555555555555555;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    uVar2 = (int)uVar3 - 1;
    uVar4 = (ulong)uVar2;
    this->instr_index = uVar2;
    this->line_num =
         (uint)((ulong)((long)pvVar1[uVar4].
                              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)pvVar1[uVar4].
                             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
            (pvVar1 + uVar4,in);
  return;
}

Assistant:

void LiteScript::State::AddInstruction(const Instruction &in) {
    if (this->instr.size() == 0)
        this->instr.push_back(std::vector<Instruction>());
    if (this->instr_index >= this->instr.size()) {
        this->instr_index = this->instr.size() - 1;
        this->line_num = this->instr[this->instr_index].size();
    }
    this->instr[this->instr_index].push_back(in);
}